

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTricycle.cpp
# Opt level: O1

int __thiscall CTestTricycle::Run(CTestTricycle *this,int nTestCase)

{
  float time;
  float steering_angle;
  int iVar1;
  CTricycle *pCVar2;
  pointer p_Var3;
  SPose pose;
  
  SetFilename(this,nTestCase);
  iVar1 = ReadInputFile(this);
  if (iVar1 == 0) {
    CreateResultFiles(this);
    pCVar2 = TSingleton<CTricycle>::GetInstance();
    Write(this,0.0,pCVar2->m_pose);
    p_Var3 = (this->m_vRecord).
             super__Vector_base<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (p_Var3 != (this->m_vRecord).
                  super__Vector_base<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (TSingleton<CVirtualGyro>::m_pInstance == (CVirtualGyro *)0x0) {
          TSingleton<CVirtualGyro>::m_pInstance = (CVirtualGyro *)operator_new(0x10);
          (TSingleton<CVirtualGyro>::m_pInstance->super_TSingleton<CVirtualGyro>)._vptr_TSingleton =
               (_func_int **)&PTR__TSingleton_00108c78;
          TSingleton<CVirtualGyro>::m_pInstance->m_fAngVel = 0.0;
          TSingleton<CVirtualGyro>::m_pInstance->m_fAngleRad = 0.0;
        }
        CVirtualGyro::Update
                  (TSingleton<CVirtualGyro>::m_pInstance,p_Var3->time,p_Var3->steering_angle,
                   p_Var3->encoder_ticks);
        time = p_Var3->time;
        steering_angle = p_Var3->steering_angle;
        iVar1 = p_Var3->encoder_ticks;
        if (TSingleton<CVirtualGyro>::m_pInstance == (CVirtualGyro *)0x0) {
          TSingleton<CVirtualGyro>::m_pInstance = (CVirtualGyro *)operator_new(0x10);
          (TSingleton<CVirtualGyro>::m_pInstance->super_TSingleton<CVirtualGyro>)._vptr_TSingleton =
               (_func_int **)&PTR__TSingleton_00108c78;
          TSingleton<CVirtualGyro>::m_pInstance->m_fAngVel = 0.0;
          TSingleton<CVirtualGyro>::m_pInstance->m_fAngleRad = 0.0;
        }
        pose = estimate(time,steering_angle,iVar1,TSingleton<CVirtualGyro>::m_pInstance->m_fAngVel);
        Write(this,p_Var3->time,pose);
        p_Var3 = p_Var3 + 1;
      } while (p_Var3 != (this->m_vRecord).
                         super__Vector_base<CTestTricycle::_tagSRecord,_std::allocator<CTestTricycle::_tagSRecord>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::ofstream::close();
    std::ofstream::close();
    iVar1 = 0;
    DrawGnuplot(this,false,0.0,0.0,0.0,0.0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press any key in this window to quit.",0x25);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    getch();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error occurred in ReadInputFile().",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int CTestTricycle::Run(const int nTestCase)
{
	/// robot pose (x, y, heading)
	SPose pose;

	/// set filenames for input, pose, and contour
	SetFilename(nTestCase);

	/// read the input file
	if (ReadInputFile() != 0)
	{
		std::cout << "Error occurred in ReadInputFile()." << std::endl;
		return -1;
	}

	/// create result files (pose, contour)
	CreateResultFiles();

	/// write initial pose to output files
	//@{
	CTricycle::GetInstance()->GetRobotPose(pose);
	Write(0.f, pose);
	//@}

	/// calculate odometry for each record
	//@{
	for (std::vector<SRecord>::iterator it = m_vRecord.begin(); \
		it != m_vRecord.end(); ++it)
	{
		/*
		std::cout << "time: ";
		std::cout.setf(std::ios::fixed);
		std::cout.precision(3);
		std::cout << it->time << ", ";
		std::cout.unsetf(std::ios::fixed);

		std::cout << "steering_angle: ";
		std::cout.setf(std::ios::fixed);
		std::cout.precision(3);
		std::cout << it->steering_angle << ", ";
		std::cout.unsetf(std::ios::fixed);

		std::cout << "encoder_ticks: ";
		std::cout << std::setfill('0') << std::setw(3);
		std::cout << it->encoder_ticks << ", ";

		std::cout << "angular_velocity: ";
		std::cout.setf(std::ios::fixed);
		std::cout.precision(3);
		std::cout << it->angular_velocity << std::endl;
		std::cout.unsetf(std::ios::fixed);
		*/

		/// update virtual gyro
		CVirtualGyro::GetInstance()->Update(it->time, it->steering_angle, it->encoder_ticks);

		/// calculate robot pose
		pose = estimate( \
			it->time, \
			it->steering_angle, \
			it->encoder_ticks, \
			CVirtualGyro::GetInstance()->GetAngVel());

		/// write a robot pose to the output files (pose, contour)
		Write(it->time, pose);
	}
	//@}

	/// close result files (pose, contour)
	CloseResultFiles();

	/// draw a result plot
	DrawGnuplot();

	/// wait for user's key press
	//@{
	std::cout << "Press any key in this window to quit." << std::endl;
	getch();
	//@}

#if defined(WIN32)
	if (m_pGnuPlot)
		delete m_pGnuPlot;	///< delete CpGnuplot instance
#else // defined(WIN32)
#endif // defined(WIN32)

	return 0;
}